

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall pbrt::Array2D<pbrt::SPPMPixel>::~Array2D(Array2D<pbrt::SPPMPixel> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar2 = vpsubd_avx(auVar1,auVar2);
  auVar1 = vpshufd_avx(auVar2,0x55);
  auVar1 = vpmulld_avx(auVar1,auVar2);
  pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<pbrt::SPPMPixel>
            (&this->allocator,this->values,(long)auVar1._0_4_);
  return;
}

Assistant:

~Array2D() {
        int n = extent.Area();
        for (int i = 0; i < n; ++i)
            allocator.destroy(values + i);
        allocator.deallocate_object(values, n);
    }